

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

cTValue * str2num(cTValue *o,TValue *n)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = o->it64 >> 0x2f;
  if (uVar2 < 0xfffffffffffffff2) {
    return o;
  }
  if ((uVar2 == 0xfffffffffffffffb) &&
     (iVar1 = lj_strscan_num((GCstr *)(o->it64 & 0x7fffffffffff),n), iVar1 != 0)) {
    return n;
  }
  return (cTValue *)0x0;
}

Assistant:

static cTValue *str2num(cTValue *o, TValue *n)
{
  if (tvisnum(o))
    return o;
  else if (tvisint(o))
    return (setnumV(n, (lua_Number)intV(o)), n);
  else if (tvisstr(o) && lj_strscan_num(strV(o), n))
    return n;
  else
    return NULL;
}